

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::_alloc(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         *this,uint n)

{
  undefined8 *puVar1;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar2;
  ulong __n;
  long lVar3;
  
  if (n == 0) {
    pMVar2 = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  }
  else {
    __n = (ulong)n;
    pMVar2 = __gnu_cxx::new_allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocate
                       ((new_allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,__n,
                        (void *)0x0);
    this->first = pMVar2;
    for (lVar3 = 0; __n * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      puVar1 = (undefined8 *)
               ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    this->last = pMVar2 + __n;
  }
  this->_array = pMVar2;
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }